

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O1

void __thiscall CTcTokenizer::splice_string(CTcTokenizer *this)

{
  wchar_t qu;
  int iVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  wchar_t wVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  size_t sVar9;
  ulong uVar10;
  char *__n;
  char cVar11;
  byte *pbVar12;
  utf8_ptr uVar13;
  byte *pbVar14;
  utf8_ptr local_48;
  uint local_40;
  wchar_t local_3c;
  CTcTokString *local_38;
  
  qu = this->in_quote_;
  uVar10 = (this->linebuf_).buf_len_;
  local_3c = L'\0';
  uVar7 = 0;
  if (1 < uVar10) {
    uVar7 = (uint)(*(short *)((this->linebuf_).buf_ + (uVar10 - 2)) == 0x6e5c);
  }
  iVar1 = this->in_triple_;
  local_38 = &this->linebuf_;
  local_48.p_ = (char *)0x0;
LAB_00221b74:
  if (this->string_newline_spacing_ == NEWLINE_SPACING_PRESERVE) {
    (*(this->linebuf_)._vptr_CTcTokString[2])(local_38,(this->linebuf_).buf_len_ + 2);
    pcVar2 = (this->linebuf_).buf_ + (this->linebuf_).buf_len_;
    pcVar2[0] = '\\';
    pcVar2[1] = 'n';
    lVar8 = 2;
LAB_00221bef:
    sVar9 = lVar8 + (this->linebuf_).buf_len_;
    (this->linebuf_).buf_len_ = sVar9;
    (this->linebuf_).buf_[sVar9] = '\0';
  }
  else if ((this->string_newline_spacing_ == NEWLINE_SPACING_COLLAPSE) && (uVar7 == 0)) {
    (*(this->linebuf_)._vptr_CTcTokString[2])(local_38,(this->linebuf_).buf_len_ + 1);
    (this->linebuf_).buf_[(this->linebuf_).buf_len_] = ' ';
    lVar8 = 1;
    goto LAB_00221bef;
  }
  iVar4 = read_line(this,1);
  if (iVar4 == -1) {
    bVar3 = false;
  }
  else {
    pbVar12 = (byte *)((this->linebuf_).buf_ + iVar4);
    uVar13.p_ = (char *)pbVar12;
    if ((this->string_newline_spacing_ != NEWLINE_SPACING_PRESERVE) && (uVar7 == 0)) {
      local_48.p_ = (char *)pbVar12;
      wVar5 = utf8_ptr::s_getch((char *)pbVar12);
      while (((uint)wVar5 < 0x80 && (iVar6 = isspace(wVar5), iVar6 != 0))) {
        uVar13.p_ = uVar13.p_ +
                    (ulong)((((byte)*uVar13.p_ >> 5 & 1) != 0) + 1 &
                           (uint)((byte)*uVar13.p_ >> 7) * 3) + 1;
        wVar5 = utf8_ptr::s_getch(uVar13.p_);
      }
    }
    local_48.p_ = uVar13.p_;
    sVar9 = (this->linebuf_).buf_len_;
    uVar7 = 0;
    if (1 < sVar9 - (long)iVar4) {
      uVar7 = (uint)(*(short *)((this->linebuf_).buf_ + (sVar9 - 2)) == 0x6e5c);
    }
    if (pbVar12 < local_48.p_) {
      pcVar2 = (this->linebuf_).buf_;
      __n = pcVar2 + (sVar9 - (long)local_48.p_);
      pbVar14 = pbVar12 + ((long)__n - (long)pcVar2);
      memmove(pbVar12,local_48.p_,(size_t)__n);
      (this->linebuf_).buf_len_ = (size_t)pbVar14;
      if (pbVar14 < (byte *)(this->linebuf_).buf_size_) {
        (this->linebuf_).buf_[(long)pbVar14] = '\0';
      }
    }
    local_48.p_ = (char *)pbVar12;
    local_40 = uVar7;
    wVar5 = utf8_ptr::s_getch((char *)pbVar12);
    if ((wVar5 != L'}') && (wVar5 = utf8_ptr::s_getch((char *)pbVar12), wVar5 != L';')) {
LAB_00221da1:
      do {
        local_48.p_ = (char *)pbVar12;
        wVar5 = utf8_ptr::s_getch((char *)pbVar12);
        if (wVar5 == L'\\') {
          pbVar12 = pbVar12 + (ulong)(((*pbVar12 >> 5 & 1) != 0) + 1 & (uint)(*pbVar12 >> 7) * 3) +
                              1;
          local_48.p_ = (char *)pbVar12;
          if ((iVar1 == 0) || (wVar5 = utf8_ptr::s_getch((char *)pbVar12), wVar5 != qu)) {
            wVar5 = utf8_ptr::s_getch((char *)pbVar12);
            uVar13.p_ = local_48.p_;
            if (wVar5 == L'<') {
              while (wVar5 = utf8_ptr::s_getch(uVar13.p_), wVar5 == L'<') {
                uVar13.p_ = (char *)((byte *)uVar13.p_ +
                                    (ulong)((((byte)*uVar13.p_ >> 5 & 1) != 0) + 1 &
                                           (uint)((byte)*uVar13.p_ >> 7) * 3) + 1);
              }
            }
          }
          else {
            iVar4 = count_quotes(&local_48,qu);
            uVar13.p_ = local_48.p_;
            if (iVar4 + -1 != 0) {
              lVar8 = (long)(iVar4 + -1);
              do {
                pbVar12 = pbVar12 + (ulong)(((*pbVar12 >> 5 & 1) != 0) + 1 &
                                           (uint)(*pbVar12 >> 7) * 3) + 1;
                lVar8 = lVar8 + -1;
                uVar13.p_ = (char *)pbVar12;
              } while (lVar8 != 0);
            }
          }
LAB_00221f85:
          local_48.p_ = uVar13.p_;
          iVar4 = 0;
        }
        else if (wVar5 == qu) {
          if (iVar1 == 0) {
            local_48.p_ = (char *)(pbVar12 +
                                  (ulong)(((*pbVar12 >> 5 & 1) != 0) + 1 & (uint)(*pbVar12 >> 7) * 3
                                         ) + 1);
            iVar4 = 0xb;
          }
          else {
            uVar7 = count_quotes(&local_48,wVar5);
            iVar4 = 0;
            if (2 < (int)uVar7) {
              uVar10 = (ulong)uVar7;
              do {
                pbVar12 = pbVar12 + (ulong)(((*pbVar12 >> 5 & 1) != 0) + 1 &
                                           (uint)(*pbVar12 >> 7) * 3) + 1;
                uVar10 = uVar10 - 1;
              } while (uVar10 != 0);
              iVar4 = 0xb;
              local_48.p_ = (char *)pbVar12;
            }
            uVar13.p_ = local_48.p_;
            if ((int)uVar7 < 3) goto LAB_00221f85;
          }
        }
        else {
          iVar4 = 0xc;
          if (wVar5 != L'\0') {
            uVar13.p_ = local_48.p_;
            if ((wVar5 != L'<') ||
               (wVar5 = utf8_ptr::s_getch_at((char *)pbVar12,1), uVar13.p_ = local_48.p_,
               wVar5 != L'<')) goto LAB_00221f85;
            uVar10 = (ulong)(((*pbVar12 >> 5 & 1) != 0) + 1 & (uint)(*pbVar12 >> 7) * 3);
            local_48.p_ = (char *)(pbVar12 +
                                  (((pbVar12[uVar10 + 1] >> 5 & 1) != 0) + 1 &
                                  (uint)(pbVar12[uVar10 + 1] >> 7) * 3) + uVar10 + 2);
            wVar5 = utf8_ptr::s_getch(local_48.p_);
            iVar4 = 0xb;
            if (wVar5 == L'%') {
              scan_sprintf_spec(this,&local_48);
            }
          }
        }
        if (iVar4 != 0) goto LAB_00221fea;
        pbVar12 = (byte *)(local_48.p_ +
                          (ulong)((((byte)*local_48.p_ >> 5 & 1) != 0) + 1 &
                                 (uint)((byte)*local_48.p_ >> 7) * 3) + 1);
      } while( true );
    }
    pbVar14 = pbVar12 + (ulong)(((*pbVar12 >> 5 & 1) != 0) + 1 & (uint)(*pbVar12 >> 7) * 3) + 1;
    local_48.p_ = (char *)pbVar14;
    wVar5 = utf8_ptr::s_getch((char *)pbVar14);
    while (((uint)wVar5 < 0x80 && (iVar4 = isspace(wVar5), iVar4 != 0))) {
      pbVar14 = pbVar14 + (ulong)(((*pbVar14 >> 5 & 1) != 0) + 1 & (uint)(*pbVar14 >> 7) * 3) + 1;
      local_48.p_ = (char *)pbVar14;
      wVar5 = utf8_ptr::s_getch((char *)pbVar14);
    }
    wVar5 = utf8_ptr::s_getch((char *)pbVar14);
    if (wVar5 != L'\0') goto LAB_00221da1;
    bVar3 = false;
    log_error(0x2743,this->appended_linenum_);
    this->in_quote_ = L'\0';
    process_comments(this,(long)pbVar12 - (long)(this->linebuf_).buf_);
    uVar7 = local_40;
    local_48.p_ = (char *)pbVar12;
    local_3c = qu;
  }
  goto LAB_0022203d;
LAB_00221fea:
  uVar7 = local_40;
  if (iVar4 == 0xc) {
    bVar3 = true;
  }
  else {
    bVar3 = false;
  }
LAB_0022203d:
  if (!bVar3) {
    if ((byte *)local_48.p_ != (byte *)0x0) {
      unsplice_line(this,local_48.p_);
    }
    cVar11 = (char)local_3c;
    if (cVar11 != '\0') {
      (*(this->linebuf_)._vptr_CTcTokString[2])(local_38,(this->linebuf_).buf_len_ + 1);
      (this->linebuf_).buf_[(this->linebuf_).buf_len_] = cVar11;
      sVar9 = (this->linebuf_).buf_len_;
      (this->linebuf_).buf_len_ = sVar9 + 1;
      (this->linebuf_).buf_[sVar9 + 1] = '\0';
    }
    return;
  }
  goto LAB_00221b74;
}

Assistant:

void CTcTokenizer::splice_string()
{
    /* presume we'll find proper termination */
    char unterm = '\0';

    /* 
     *   remember the current in-quote and in-embedding status, as of the
     *   end of the current line - when we splice, the line reader will
     *   update these to the status at the end of the newly-read material,
     *   but we want to scan from the beginning of the newly-read material 
     */
    wchar_t in_quote = in_quote_;
    int in_triple = in_triple_;

    /* note if the previous line ended with an explicit \n sequence */
    int explicit_nl = (linebuf_.get_text_len() >= 2
                       && memcmp(linebuf_.get_text_end() - 2, "\\n", 2) == 0);
        
    /* keep going until we find the end of the string */
    utf8_ptr p((char *)0);
    for (;;)
    {
        /* apply the newline spacing mode */
        switch (string_newline_spacing_)
        {
        case NEWLINE_SPACING_COLLAPSE:
            /* 
             *   Replace the newline and any subsequent run of whitespace
             *   characters with a single space, unless the last line ended
             *   with an explicit newline.
             */
            if (!explicit_nl)
                linebuf_.append(" ", 1);
            break;

        case NEWLINE_SPACING_DELETE:
            /* delete the newline and subsequent whitespace */
            break;

        case NEWLINE_SPACING_PRESERVE:
            /* 
             *   preserve the newline and subsequent whitespace exactly as
             *   written in the source code, so convert the newline to an
             *   explicit \n sequence (in source form, since we're building a
             *   source line at this point)
             */
            linebuf_.append("\\n", 2);
            break;
        }

        /* splice another line */
        int new_line_ofs = read_line(TRUE);

        /* if we reached end of file, there's no more splicing we can do */
        if (new_line_ofs == -1)
            break;

        /* get a pointer to the new text */
        char *new_line_p = (char *)linebuf_.get_text() + new_line_ofs;
        p.set(new_line_p);

        /* 
         *   If we're in COLLAPSE or DELETE mode for newline spacing, skip
         *   leading spaces in the new line.  However, override this if the
         *   previous line ended with an explicit \n sequence; this tells us
         *   that the line break is explicitly part of the string and that
         *   the subsequent whitespace is to be preserved.
         */
        if (string_newline_spacing_ != NEWLINE_SPACING_PRESERVE
            && !explicit_nl)
            for ( ; is_space(p.getch()) ; p.inc()) ;

        /* check to see if the newly spliced text ends in an explicit \n */
        explicit_nl = (linebuf_.get_text_len() - new_line_ofs >= 2
                       && memcmp(linebuf_.get_text_end() - 2, "\\n", 2) == 0);

        /* if we skipped any spaces, remove them from the text */
        if (p.getptr() > new_line_p)
        {
            /* calculate the length of the rest of the line */
            size_t rem = linebuf_.get_text_len()
                         - (p.getptr() - linebuf_.get_buf());

            /* calculate the new length of the line */
            size_t new_len = (new_line_p - linebuf_.get_buf()) + rem;

            /* move the rest of the line down over the spaces */
            memmove(new_line_p, p.getptr(), rem);

            /* set the new length */
            linebuf_.set_text_len(new_len);
        }

        /* 
         *   If the new line contains only "}" or ";", presume that the
         *   string is unterminated and terminate it here.  (This
         *   heuristic could flag well-formed strings as erroneous, but
         *   users can always work around this by moving these characters
         *   onto lines that contain at least one other non-whitespace
         *   character.)  
         */
        p.set(new_line_p);
        if (p.getch() == '}' || p.getch() == ';')
        {
            /* skip trailing whitespace */
            for (p.inc() ; is_space(p.getch()) ; p.inc()) ;
            
            /* 
             *   if there's nothing else on the line, presume it's an
             *   unterminated string 
             */
            if (p.getch() == '\0')
            {
                /* log the error */
                log_error(TCERR_POSSIBLE_UNTERM_STR,
                          appended_linenum_);

                /* remember that it's unterminated */
                unterm = (char)in_quote;

                /* 
                 *   since we're adding a presumed close quote that never
                 *   appears in the text, we need to figure the new
                 *   in-string status for the line; clear the in-quote
                 *   flag, and re-scan comments from the current point on
                 *   the line 
                 */
                in_quote_ = '\0';
                process_comments(new_line_p - linebuf_.get_buf());

                /* we're done - unsplice from the start of the new line */
                p.set(new_line_p);
                goto done;
            }
        }

        /* scan for the end of the string */
        for (p.set(new_line_p) ; ; p.inc())
        {
            /* get this character */
            wchar_t cur = p.getch();

            /* see what we have */
            if (cur == '\\')
            {
                /* it's a backslash sequence - skip the extra character */
                p.inc();

                /* 
                 *   in a triple-quoted string, a backslash escapes a whole
                 *   run of consecutive quote characters 
                 */
                if (in_triple && p.getch() == in_quote)
                {
                    /* skip all but the last consecutive quote */
                    int qcnt = count_quotes(&p, in_quote);
                    p.inc_by(qcnt - 1);
                }
                else if (p.getch() == '<')
                {
                    /* skip a run of <'s */
                    for ( ; p.getch() == '<' ; p.inc()) ;
                }
            }
            else if (cur == in_quote)
            {
                /* it's our quote character - check for triple quotes */
                if (in_triple)
                {
                    /* in a triple-quoted string - we need 3+ to end it */
                    int qcnt = count_quotes(&p, cur);
                    if (qcnt >= 3)
                    {
                        /* we have at least 3 - skip them and exit */
                        p.inc_by(qcnt);
                        goto done;
                    }
                }
                else
                {
                    /* regular string - skip it and exit the string */
                    p.inc();
                    goto done;
                }
            }
            else if (cur == '<' && p.getch_at(1) == '<')
            {
                /* 
                 *   it's an embedded expression starter - skip the '<<'
                 *   sequence and stop scanning 
                 */
                p.inc();
                p.inc();

                /* check for a '%' sprintf code */
                if (p.getch() == '%')
                    scan_sprintf_spec(&p);

                /* done */
                goto done;
            }
            else if (cur == '\0')
            {
                /* end of line - go back and splice another line */
                break;
            }
        }
    }

done:
    /* if we actually spliced anything, unsplice it at the current point */
    if (p.getptr() != 0)
        unsplice_line(p.getptr());

    /* if we found an unterminated string, supply implicit termination */
    if (unterm != '\0')
        linebuf_.append(&unterm, 1);
}